

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-legacy.cc
# Opt level: O1

bool __thiscall DataSourceLegacy::load_animation_table(DataSourceLegacy *this,PBuffer *data)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  element_type *peVar4;
  void *pvVar5;
  size_t i;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  value_type *pvVar12;
  int j;
  anon_union_4_2_7f9ed247 dest;
  Animation a;
  size_t sizes [200];
  value_type local_6b8;
  Animation local_69c;
  vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
  *local_690;
  element_type *local_688;
  undefined8 local_680;
  ulong local_678 [201];
  
  peVar4 = (data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar4->endianess = EndianessBig;
  local_688 = peVar4;
  if (peVar4 != (element_type *)0x0) {
    pvVar5 = peVar4->data;
    lVar6 = 0;
    local_690 = (vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
                 *)this;
    do {
      local_678[0]._0_4_ = *(undefined4 *)((long)pvVar5 + lVar6 * 4);
      lVar9 = 4;
      pvVar12 = &local_6b8;
      do {
        *(undefined1 *)pvVar12 = *(undefined1 *)((long)local_678 + lVar9 + -1);
        pvVar12 = (value_type *)((long)pvVar12 + 1);
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
      *(undefined4 *)((long)pvVar5 + lVar6 * 4) =
           local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 200);
    uVar11 = peVar4->size;
    lVar6 = 0;
    do {
      uVar2 = *(uint *)((long)pvVar5 + lVar6 * 4);
      lVar9 = 0;
      uVar7 = uVar11;
      do {
        uVar3 = *(uint *)((long)pvVar5 + lVar9 * 4);
        uVar8 = (ulong)uVar3;
        if (uVar7 < uVar3) {
          uVar8 = uVar7;
        }
        if (uVar3 <= uVar2) {
          uVar8 = uVar7;
        }
        lVar9 = lVar9 + 1;
        uVar7 = uVar8;
      } while (lVar9 != 200);
      local_678[lVar6] = (uVar8 - uVar2) / 3;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 200);
    local_690 = &((DataSourceBase *)
                 &local_690->
                  super__Vector_base<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
                 )->animation_table;
    local_680 = (long)pvVar5 + 2;
    lVar6 = 0;
    do {
      local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
      super__Vector_impl_data._M_finish = (Animation *)0x0;
      local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (Animation *)0x0;
      uVar11 = local_678[lVar6];
      if (uVar11 != 0) {
        pcVar10 = (char *)(*(int *)((long)pvVar5 + lVar6 * 4) + local_680);
        do {
          uVar1 = pcVar10[-2];
          local_69c.sprite = uVar1;
          local_69c.x = (int)pcVar10[-1];
          local_69c.y = (int)*pcVar10;
          if (local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Data::Animation,std::allocator<Data::Animation>>::
            _M_realloc_insert<Data::Animation_const&>
                      ((vector<Data::Animation,std::allocator<Data::Animation>> *)&local_6b8,
                       (iterator)
                       local_6b8.
                       super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl
                       .super__Vector_impl_data._M_finish,&local_69c);
          }
          else {
            (local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl
             .super__Vector_impl_data._M_finish)->y = local_69c.y;
            (local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl
             .super__Vector_impl_data._M_finish)->sprite = uVar1;
            *(undefined3 *)
             &(local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
               _M_impl.super__Vector_impl_data._M_finish)->field_0x1 = local_69c._1_3_;
            (local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl
             .super__Vector_impl_data._M_finish)->x = local_69c.x;
            local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pcVar10 = pcVar10 + 3;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      std::
      vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
      ::push_back(local_690,&local_6b8);
      if (local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_6b8.
                        super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_6b8.
                              super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_6b8.
                              super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 200);
  }
  return local_688 != (element_type *)0x0;
}

Assistant:

bool
DataSourceLegacy::load_animation_table(PBuffer data) {
  // The serf animation table is stored in big endian order in the data file.
  data->set_endianess(Buffer::EndianessBig);

  // * Starts with 200 uint32s that are offsets from the start
  // of this table to an animation table (one for each animation).
  // * The animation tables are of varying lengths.
  // Each entry in the animation table is three bytes long.
  // First byte is used to determine the serf body sprite.
  // Second byte is a signed horizontal sprite offset.
  // Third byte is a signed vertical offset.

  if (data == nullptr) {
    return false;
  }
  uint32_t *animation_block = reinterpret_cast<uint32_t*>(data->get_data());

  // Endianess convert from big endian.
  for (size_t i = 0; i < 200; i++) {
    animation_block[i] = betoh(animation_block[i]);
  }

  size_t sizes[200];

  for (size_t i = 0; i < 200; i++) {
    size_t a = animation_block[i];
    size_t next = data->get_size();
    for (int j = 0; j < 200; j++) {
      size_t b = animation_block[j];
      if (b > a) {
        next = std::min(next, b);
      }
    }
    sizes[i] = (next - a)/3;
  }

  for (size_t i = 0; i < 200; i++) {
    int offset = animation_block[i];
    AnimationPhase *anims =
    reinterpret_cast<AnimationPhase*>(reinterpret_cast<char*>(animation_block) +
                                      offset);
    std::vector<Data::Animation> animations;
    for (size_t j = 0; j < sizes[i]; j++) {
      Data::Animation a;
      a.sprite = anims[j].sprite;
      a.x = anims[j].x;
      a.y = anims[j].y;
      animations.push_back(a);
    }
    animation_table.push_back(animations);
  }

  return true;
}